

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluDrawUtil.cpp
# Opt level: O2

void glu::drawFromUserPointers
               (RenderContext *context,deUint32 program,int numVertexArrays,
               VertexArrayBinding *vertexArrays,PrimitiveList *primitives,DrawUtilCallback *callback
               )

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  TestError *this;
  pointer pVVar3;
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> bindingsWithLocations;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  int local_3c;
  void *local_38;
  Functions *gl;
  
  iVar2 = (*context->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar2);
  bindingsWithLocations.
  super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bindingsWithLocations.
  super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  bindingsWithLocations.
  super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (anonymous_namespace)::
  namedBindingsToProgramLocations<glu::VertexArrayBinding_const*,std::insert_iterator<std::vector<glu::VertexArrayBinding,std::allocator<glu::VertexArrayBinding>>>>
            ((_anonymous_namespace_ *)gl,(Functions *)(ulong)program,(deUint32)vertexArrays,
             vertexArrays + numVertexArrays,(VertexArrayBinding *)&bindingsWithLocations,
             (insert_iterator<std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
              )ZEXT816(0));
  bVar1 = (anonymous_namespace)::
          areVertexArrayLocationsValid<__gnu_cxx::__normal_iterator<glu::VertexArrayBinding*,std::vector<glu::VertexArrayBinding,std::allocator<glu::VertexArrayBinding>>>>
                    ((__normal_iterator<glu::VertexArrayBinding_*,_std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
                      )bindingsWithLocations.
                       super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<glu::VertexArrayBinding_*,_std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
                      )bindingsWithLocations.
                       super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  if (!bVar1) {
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,(char *)0x0,
               "areVertexArrayLocationsValid(bindingsWithLocations.begin(), bindingsWithLocations.end())"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluDrawUtil.cpp"
               ,0x1fa);
    __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  for (pVVar3 = bindingsWithLocations.
                super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pVVar3 != bindingsWithLocations.
                super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                ._M_impl.super__Vector_impl_data._M_finish; pVVar3 = pVVar3 + 1) {
    local_50._M_allocated_capacity._0_4_ = (pVVar3->binding).location;
    local_3c = (pVVar3->pointer).stride;
    local_38 = (pVVar3->pointer).data;
    local_50._4_4_ = (pVVar3->pointer).componentType;
    local_50._8_4_ = (pVVar3->pointer).convert;
    unique0x10000194 = *(undefined8 *)&(pVVar3->pointer).numComponents;
    anon_unknown_4::setVertexAttribPointer(gl,(VertexAttributeDescriptor *)&local_50);
  }
  if (callback != (DrawUtilCallback *)0x0) {
    (**callback->_vptr_DrawUtilCallback)(callback);
  }
  if (primitives->indices == (void *)0x0) {
    anon_unknown_4::drawNonIndexed(gl,primitives->type,primitives->numElements);
  }
  else {
    anon_unknown_4::drawIndexed
              (gl,primitives->type,primitives->numElements,primitives->indexType,primitives->indices
              );
  }
  pVVar3 = bindingsWithLocations.
           super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (callback != (DrawUtilCallback *)0x0) {
    (*callback->_vptr_DrawUtilCallback[1])(callback);
    pVVar3 = bindingsWithLocations.
             super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
             _M_impl.super__Vector_impl_data._M_start;
  }
  for (; pVVar3 != bindingsWithLocations.
                   super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                   ._M_impl.super__Vector_impl_data._M_finish; pVVar3 = pVVar3 + 1) {
    (*gl->disableVertexAttribArray)((pVVar3->binding).location);
  }
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::~vector
            (&bindingsWithLocations);
  return;
}

Assistant:

void drawFromUserPointers (const RenderContext& context, deUint32 program, int numVertexArrays, const VertexArrayBinding* vertexArrays, const PrimitiveList& primitives, DrawUtilCallback* callback)
{
	const glw::Functions&				gl		= context.getFunctions();
	std::vector<VertexArrayBinding>		bindingsWithLocations;

	DE_ASSERT(isDrawCallValid(numVertexArrays, vertexArrays, primitives));
	DE_ASSERT(isProgramActive(context, program));

	// Lower bindings to locations.
	namedBindingsToProgramLocations(gl, program, vertexArrays, vertexArrays+numVertexArrays, std::inserter(bindingsWithLocations, bindingsWithLocations.begin()));

	TCU_CHECK(areVertexArrayLocationsValid(bindingsWithLocations.begin(), bindingsWithLocations.end()));

	// Set VA state.
	for (std::vector<VertexArrayBinding>::const_iterator vaIter = bindingsWithLocations.begin(); vaIter != bindingsWithLocations.end(); ++vaIter)
		setVertexAttribPointer(gl, getUserPointerDescriptor(*vaIter));

	if (callback)
		callback->beforeDrawCall();

	if (primitives.indices)
		drawIndexed(gl, primitives.type, primitives.numElements, primitives.indexType, primitives.indices);
	else
		drawNonIndexed(gl, primitives.type, primitives.numElements);

	if (callback)
		callback->afterDrawCall();

	// Disable attribute arrays or otherwise someone later on might get crash thanks to invalid pointers.
	disableVertexArrays(gl, bindingsWithLocations);
}